

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::AV1LbdInvTxfm2d_gt_int16_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::AV1LbdInvTxfm2d_gt_int16_Test> *this)

{
  AV1LbdInvTxfm2d *this_00;
  
  WithParamInterface<std::tuple<void(*const)(int_const*,unsigned_char*,int,unsigned_char,unsigned_char,int)>>
  ::parameter_ = &this->parameter_;
  this_00 = (AV1LbdInvTxfm2d *)operator_new(0x20);
  anon_unknown.dwarf_1612e9d::AV1LbdInvTxfm2d::AV1LbdInvTxfm2d(this_00);
  (this_00->
  super_TestWithParam<std::tuple<void_(*const)(const_int_*,_unsigned_char_*,_int,_unsigned_char,_unsigned_char,_int)>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00f40760;
  (this_00->
  super_TestWithParam<std::tuple<void_(*const)(const_int_*,_unsigned_char_*,_int,_unsigned_char,_unsigned_char,_int)>_>
  ).
  super_WithParamInterface<std::tuple<void_(*const)(const_int_*,_unsigned_char_*,_int,_unsigned_char,_unsigned_char,_int)>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__AV1LbdInvTxfm2d_gt_int16_Test_00f407a0;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }